

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O0

void __thiscall fc_layer_t::fix_weights(fc_layer_t *this)

{
  point_t d;
  tensor_t<float> *this_00;
  float *pfVar1;
  float *pfVar2;
  fc_layer_t *in_RDI;
  float fVar3;
  float *w;
  int m;
  int z;
  int j;
  int i;
  gradient_t *grad;
  int n;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  tensor_t<float> *in_stack_ffffffffffffffa0;
  int local_24;
  int local_20;
  int local_1c;
  int local_c;
  
  for (local_c = 0; local_c < (in_RDI->super_layer_t).out.size.x; local_c = local_c + 1) {
    this_00 = (tensor_t<float> *)
              std::vector<gradient_t,_std::allocator<gradient_t>_>::operator[]
                        (&in_RDI->gradients,(long)local_c);
    for (local_1c = 0; local_1c < (in_RDI->super_layer_t).in.size.x; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < (in_RDI->super_layer_t).in.size.y; local_20 = local_20 + 1) {
        for (local_24 = 0; local_24 < (in_RDI->super_layer_t).in.size.z; local_24 = local_24 + 1) {
          d.y = local_20;
          d.x = local_1c;
          d.z = local_24;
          map(in_RDI,d);
          pfVar1 = tensor_t<float>::operator()
                             (in_stack_ffffffffffffffa0,(int)in_stack_ffffffffffffff9c,
                              in_stack_ffffffffffffff98,0);
          in_stack_ffffffffffffff9c = *pfVar1;
          in_stack_ffffffffffffffa0 = this_00;
          pfVar2 = tensor_t<float>::operator()
                             (this_00,(int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
          fVar3 = update_weight(in_stack_ffffffffffffff9c,(gradient_t *)in_stack_ffffffffffffffa0,
                                *pfVar2);
          *pfVar1 = fVar3;
        }
      }
    }
    update_gradient((gradient_t *)this_00);
  }
  return;
}

Assistant:

void fix_weights() {
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            float &w = weights(m, n, 0);
            w = update_weight(w, grad, in(i, j, z));
          }

      update_gradient(grad);
    }
  }